

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration_test.cc
# Opt level: O3

void __thiscall
prometheus::anon_unknown_0::IntegrationTest_exposesCountersOnDifferentUrls_Test::TestBody
          (IntegrationTest_exposesCountersOnDifferentUrls_Test *this)

{
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  substring;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var1;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_00;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_01;
  StringLike<std::__cxx11::basic_string<char>_> *extraout_RDX_02;
  StringLike<std::__cxx11::basic_string<char>_> *extraout_RDX_03;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  extraout_RDX_04;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_05;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_06;
  StringLike<std::__cxx11::basic_string<char>_> *extraout_RDX_07;
  StringLike<std::__cxx11::basic_string<char>_> *extraout_RDX_08;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  extraout_RDX_09;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_10;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_11;
  StringLike<std::__cxx11::basic_string<char>_> *extraout_RDX_12;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  extraout_RDX_13;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  extraout_RDX_14;
  StringLike<std::__cxx11::basic_string<char>_> *extraout_RDX_15;
  undefined8 *puVar2;
  char *pcVar3;
  AssertionResult AVar4;
  string first_counter_name;
  string second_metrics_path;
  string first_metrics_path;
  string second_counter_name;
  shared_ptr<prometheus::Registry> second_registry;
  shared_ptr<prometheus::Registry> first_registry;
  Response second_metrics;
  Response first_metrics;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_270;
  undefined8 *local_268;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_260 [16];
  AssertHelper local_250;
  undefined8 *local_248;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_240 [2];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_230 [16];
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  undefined1 *local_1a0;
  long local_198;
  undefined1 local_190 [16];
  undefined1 *local_180;
  long local_178;
  undefined1 local_170 [16];
  undefined1 local_160 [32];
  _Any_data local_140;
  undefined1 local_130 [16];
  undefined1 local_120 [16];
  char local_110 [16];
  undefined1 local_100 [16];
  char local_f0 [16];
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e0;
  Response local_c0;
  Response local_78;
  
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"/first","");
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"/second","");
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"first_total","");
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"second_total","");
  IntegrationTest::RegisterSomeCounter
            ((IntegrationTest *)(local_160 + 0x10),(string *)this,&local_220);
  IntegrationTest::RegisterSomeCounter((IntegrationTest *)local_160,(string *)this,&local_1c0);
  IntegrationTest::FetchMetrics(&local_78,&this->super_IntegrationTest,&local_1e0);
  IntegrationTest::FetchMetrics(&local_c0,&this->super_IntegrationTest,&local_200);
  local_240[0]._M_head_impl._0_4_ = 200;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&local_270,"first_metrics.code","200",&local_78.code,(int *)local_240);
  puVar2 = local_268;
  if (local_270._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_240);
    if (local_268 == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)*local_268;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/pull/tests/integration/integration_test.cc"
               ,0x86,pcVar3);
    testing::internal::AssertHelper::operator=(&local_250,(Message *)local_240);
  }
  else {
    if (local_268 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_268 != local_268 + 2) {
        operator_delete((undefined8 *)*local_268);
      }
      operator_delete(puVar2);
    }
    local_240[0]._M_head_impl._0_4_ = 200;
    AVar4 = testing::internal::CmpHelperEQ<long,int>
                      ((internal *)&local_270,"second_metrics.code","200",&local_c0.code,
                       (int *)local_240);
    puVar2 = local_268;
    substring._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )AVar4.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
    if (local_270._M_head_impl._0_1_ != (internal)0x0) {
      if (local_268 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_268 != local_268 + 2) {
          operator_delete((undefined8 *)*local_268);
        }
        operator_delete(puVar2);
        substring._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             extraout_RDX._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
      }
      testing::HasSubstr<std::__cxx11::string>
                (&local_e0,(testing *)&local_220,
                 (StringLike<std::__cxx11::basic_string<char>_> *)
                 substring._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl);
      local_270._M_head_impl = local_260;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_270,local_e0.impl_.substring_._M_dataplus._M_p,
                 local_e0.impl_.substring_._M_dataplus._M_p +
                 local_e0.impl_.substring_._M_string_length);
      local_240[0]._M_head_impl = local_230;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_240,local_270._M_head_impl,(long)local_268 + local_270._M_head_impl
                );
      if (local_270._M_head_impl != local_260) {
        operator_delete(local_270._M_head_impl);
      }
      AVar4 = testing::internal::
              PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
              ::operator()(&local_250,(char *)local_240,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "first_metrics.body");
      _Var1._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           AVar4.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
      if (local_240[0]._M_head_impl != local_230) {
        operator_delete(local_240[0]._M_head_impl);
        _Var1 = extraout_RDX_00.
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0.impl_.substring_._M_dataplus._M_p != &local_e0.impl_.substring_.field_2) {
        operator_delete(local_e0.impl_.substring_._M_dataplus._M_p);
        _Var1._M_head_impl =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             extraout_RDX_01.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
      }
      if ((char)local_250.data_ == '\0') {
        testing::Message::Message((Message *)&local_270);
        if (local_248 == (undefined8 *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = (char *)*local_248;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_240,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/pull/tests/integration/integration_test.cc"
                   ,0x89,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_240,(Message *)&local_270);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_240);
        _Var1._M_head_impl = extraout_RDX_02;
        if (local_270._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_270._M_head_impl + 8))();
          _Var1._M_head_impl = extraout_RDX_03;
        }
      }
      puVar2 = local_248;
      if (local_248 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_248 != local_248 + 2) {
          operator_delete((undefined8 *)*local_248);
        }
        operator_delete(puVar2);
        _Var1._M_head_impl = extraout_RDX_04._M_head_impl;
      }
      testing::HasSubstr<std::__cxx11::string>
                ((PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_100,(testing *)&local_1c0,_Var1._M_head_impl);
      local_270._M_head_impl = local_260;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_270,local_100._0_8_,(char *)(local_100._0_8_ + local_100._8_8_));
      local_240[0]._M_head_impl = local_230;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_240,local_270._M_head_impl,(long)local_268 + local_270._M_head_impl
                );
      if (local_270._M_head_impl != local_260) {
        operator_delete(local_270._M_head_impl);
      }
      AVar4 = testing::internal::
              PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
              ::operator()(&local_250,(char *)local_240,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "second_metrics.body");
      _Var1._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           AVar4.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
      if (local_240[0]._M_head_impl != local_230) {
        operator_delete(local_240[0]._M_head_impl);
        _Var1 = extraout_RDX_05.
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl;
      }
      if ((char *)local_100._0_8_ != local_f0) {
        operator_delete((void *)local_100._0_8_);
        _Var1._M_head_impl =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             extraout_RDX_06.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
      }
      if ((char)local_250.data_ == '\0') {
        testing::Message::Message((Message *)&local_270);
        if (local_248 == (undefined8 *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = (char *)*local_248;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_240,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/pull/tests/integration/integration_test.cc"
                   ,0x8a,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_240,(Message *)&local_270);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_240);
        _Var1._M_head_impl = extraout_RDX_07;
        if (local_270._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_270._M_head_impl + 8))();
          _Var1._M_head_impl = extraout_RDX_08;
        }
      }
      puVar2 = local_248;
      if (local_248 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_248 != local_248 + 2) {
          operator_delete((undefined8 *)*local_248);
        }
        operator_delete(puVar2);
        _Var1._M_head_impl = extraout_RDX_09._M_head_impl;
      }
      testing::HasSubstr<std::__cxx11::string>
                ((PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_120,(testing *)&local_1c0,_Var1._M_head_impl);
      local_270._M_head_impl = local_260;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_270,local_120._0_8_,(char *)(local_120._0_8_ + local_120._8_8_));
      local_180 = local_170;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_180,local_270._M_head_impl,
                 (long)local_268 + local_270._M_head_impl);
      if (local_270._M_head_impl != local_260) {
        operator_delete(local_270._M_head_impl);
      }
      local_270._M_head_impl = local_260;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_270,local_180,local_180 + local_178);
      local_240[0]._M_head_impl = local_230;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_240,local_270._M_head_impl,(long)local_268 + local_270._M_head_impl
                );
      if (local_270._M_head_impl != local_260) {
        operator_delete(local_270._M_head_impl);
      }
      AVar4 = testing::internal::
              PredicateFormatterFromMatcher<testing::internal::NotMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>>
              ::operator()(&local_250,(char *)local_240,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "first_metrics.body");
      _Var1._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           AVar4.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
      if (local_240[0]._M_head_impl != local_230) {
        operator_delete(local_240[0]._M_head_impl);
        _Var1 = extraout_RDX_10.
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl;
      }
      if (local_180 != local_170) {
        operator_delete(local_180);
        _Var1._M_head_impl =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             extraout_RDX_11.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
      }
      if ((char *)local_120._0_8_ != local_110) {
        operator_delete((void *)local_120._0_8_);
        _Var1._M_head_impl = extraout_RDX_12;
      }
      if ((char)local_250.data_ == '\0') {
        testing::Message::Message((Message *)&local_270);
        if (local_248 == (undefined8 *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = (char *)*local_248;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_240,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/pull/tests/integration/integration_test.cc"
                   ,0x8c,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_240,(Message *)&local_270);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_240);
        _Var1._M_head_impl = extraout_RDX_13._M_head_impl;
        if (local_270._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_270._M_head_impl + 8))();
          _Var1._M_head_impl = extraout_RDX_14._M_head_impl;
        }
      }
      puVar2 = local_248;
      if (local_248 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_248 != local_248 + 2) {
          operator_delete((undefined8 *)*local_248);
        }
        operator_delete(puVar2);
        _Var1._M_head_impl = extraout_RDX_15;
      }
      testing::HasSubstr<std::__cxx11::string>
                ((PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_140,(testing *)&local_220,_Var1._M_head_impl);
      local_270._M_head_impl = local_260;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_270,local_140._M_unused._M_object,
                 (_Manager_type)(local_140._8_8_ + (long)local_140._M_unused._0_8_));
      local_1a0 = local_190;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1a0,local_270._M_head_impl,
                 (long)local_268 + local_270._M_head_impl);
      if (local_270._M_head_impl != local_260) {
        operator_delete(local_270._M_head_impl);
      }
      local_270._M_head_impl = local_260;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_270,local_1a0,local_1a0 + local_198);
      local_240[0]._M_head_impl = local_230;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_240,local_270._M_head_impl,(long)local_268 + local_270._M_head_impl
                );
      if (local_270._M_head_impl != local_260) {
        operator_delete(local_270._M_head_impl);
      }
      testing::internal::
      PredicateFormatterFromMatcher<testing::internal::NotMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>>
      ::operator()(&local_250,(char *)local_240,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "second_metrics.body");
      if (local_240[0]._M_head_impl != local_230) {
        operator_delete(local_240[0]._M_head_impl);
      }
      if (local_1a0 != local_190) {
        operator_delete(local_1a0);
      }
      if ((undefined1 *)local_140._M_unused._0_8_ != local_130) {
        operator_delete(local_140._M_unused._M_object);
      }
      puVar2 = local_248;
      if ((char)local_250.data_ == '\0') {
        testing::Message::Message((Message *)&local_270);
        if (local_248 == (undefined8 *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = (char *)*local_248;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_240,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/pull/tests/integration/integration_test.cc"
                   ,0x8d,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_240,(Message *)&local_270);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_240);
        puVar2 = local_248;
        if (local_270._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_270._M_head_impl + 8))();
          puVar2 = local_248;
        }
      }
      goto LAB_0011245f;
    }
    testing::Message::Message((Message *)local_240);
    if (local_268 == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)*local_268;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/pull/tests/integration/integration_test.cc"
               ,0x87,pcVar3);
    testing::internal::AssertHelper::operator=(&local_250,(Message *)local_240);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_250);
  puVar2 = local_268;
  if (local_240[0]._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_240[0]._M_head_impl + 8))();
    puVar2 = local_268;
  }
LAB_0011245f:
  if (puVar2 != (undefined8 *)0x0) {
    if ((undefined8 *)*puVar2 != puVar2 + 2) {
      operator_delete((undefined8 *)*puVar2);
    }
    operator_delete(puVar2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.contentType._M_dataplus._M_p != &local_c0.contentType.field_2) {
    operator_delete(local_c0.contentType._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.body._M_dataplus._M_p != &local_c0.body.field_2) {
    operator_delete(local_c0.body._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.contentType._M_dataplus._M_p != &local_78.contentType.field_2) {
    operator_delete(local_78.contentType._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.body._M_dataplus._M_p != &local_78.body.field_2) {
    operator_delete(local_78.body._M_dataplus._M_p);
  }
  if ((GTestFlagSaver *)local_160._8_8_ != (GTestFlagSaver *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_160._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_160._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_160._24_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST_F(IntegrationTest, exposesCountersOnDifferentUrls) {
  const std::string first_metrics_path = "/first";
  const std::string second_metrics_path = "/second";

  const std::string first_counter_name = "first_total";
  const std::string second_counter_name = "second_total";

  const auto first_registry =
      RegisterSomeCounter(first_counter_name, first_metrics_path);
  const auto second_registry =
      RegisterSomeCounter(second_counter_name, second_metrics_path);

  // all set-up

  const auto first_metrics = FetchMetrics(first_metrics_path);
  const auto second_metrics = FetchMetrics(second_metrics_path);

  // check results

  ASSERT_EQ(first_metrics.code, 200);
  ASSERT_EQ(second_metrics.code, 200);

  EXPECT_THAT(first_metrics.body, HasSubstr(first_counter_name));
  EXPECT_THAT(second_metrics.body, HasSubstr(second_counter_name));

  EXPECT_THAT(first_metrics.body, Not(HasSubstr(second_counter_name)));
  EXPECT_THAT(second_metrics.body, Not(HasSubstr(first_counter_name)));
}